

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomUI::write(DomUI *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QAnyStringView QVar29;
  QAnyStringView QVar30;
  QAnyStringView QVar31;
  QAnyStringView QVar32;
  QAnyStringView QVar33;
  QString local_48;
  long local_30;
  
  aVar2._4_4_ = in_register_00000034;
  aVar2._0_4_ = __fd;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"ui";
    local_48.d.size = 2;
  }
  else {
    QString::toLower_helper(&local_48);
  }
  QVar18.m_size = (size_t)local_48.d.ptr;
  QVar18.field_0.m_data = aVar2.m_data;
  QXmlStreamWriter::writeStartElement(QVar18);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (this->m_has_attr_version == true) {
    pQVar1 = &((this->m_attr_version).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_version).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar4.m_size = __n;
      QVar4.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
      QVar20.m_size = (size_t)L"version";
      QVar20.field_0.m_data = aVar2.m_data;
      QXmlStreamWriter::writeAttribute(QVar20,QVar4);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar3.m_size = __n;
      QVar3.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
      QVar19.m_size = (size_t)L"version";
      QVar19.field_0.m_data = aVar2.m_data;
      QXmlStreamWriter::writeAttribute(QVar19,QVar3);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_language == true) {
    pQVar1 = &((this->m_attr_language).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_language).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar6.m_size = __n;
      QVar6.field_0.m_data = (void *)0x8000000000000008;
      QVar22.m_size = (size_t)L"language";
      QVar22.field_0.m_data = aVar2.m_data;
      QXmlStreamWriter::writeAttribute(QVar22,QVar6);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar5.m_size = __n;
      QVar5.field_0.m_data = (void *)0x8000000000000008;
      QVar21.m_size = (size_t)L"language";
      QVar21.field_0.m_data = aVar2.m_data;
      QXmlStreamWriter::writeAttribute(QVar21,QVar5);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_displayname == true) {
    pQVar1 = &((this->m_attr_displayname).d.d)->super_QArrayData;
    __n = (size_t)(this->m_attr_displayname).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      QVar8.m_size = __n;
      QVar8.field_0.m_data = (void *)0x800000000000000b;
      QVar24.m_size = (size_t)L"displayname";
      QVar24.field_0.m_data = aVar2.m_data;
      QXmlStreamWriter::writeAttribute(QVar24,QVar8);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      QVar7.m_size = __n;
      QVar7.field_0.m_data = (void *)0x800000000000000b;
      QVar23.m_size = (size_t)L"displayname";
      QVar23.field_0.m_data = aVar2.m_data;
      QXmlStreamWriter::writeAttribute(QVar23,QVar7);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,2,0x10);
      }
    }
  }
  if (this->m_has_attr_idbasedtr == true) {
    __n = (size_t)L"false";
    if (this->m_attr_idbasedtr != false) {
      __n = (size_t)L"true";
    }
    QVar9.m_size = __n;
    QVar9.field_0.m_data = (void *)0x8000000000000009;
    QVar25.m_size = (size_t)L"idbasedtr";
    QVar25.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeAttribute(QVar25,QVar9);
  }
  if (this->m_has_attr_connectslotsbyname == true) {
    __n = (size_t)L"false";
    if (this->m_attr_connectslotsbyname != false) {
      __n = (size_t)L"true";
    }
    QVar10.m_size = __n;
    QVar10.field_0.m_data = (void *)0x8000000000000012;
    QVar26.m_size = (size_t)L"connectslotsbyname";
    QVar26.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeAttribute(QVar26,QVar10);
  }
  if (this->m_has_attr_stdsetdef == true) {
    QString::number((int)&local_48,this->m_attr_stdsetdef);
    QVar11.m_size = (size_t)local_48.d.ptr;
    QVar11.field_0.m_data = (void *)0x8000000000000009;
    QVar27.m_size = (size_t)L"stdsetdef";
    QVar27.field_0.m_data = aVar2.m_data;
    __n = (size_t)local_48.d.ptr;
    QXmlStreamWriter::writeAttribute(QVar27,QVar11);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (this->m_has_attr_stdSetDef == true) {
    QString::number((int)&local_48,this->m_attr_stdSetDef);
    QVar12.m_size = (size_t)local_48.d.ptr;
    QVar12.field_0.m_data = (void *)0x8000000000000009;
    QVar28.m_size = (size_t)L"stdsetdef";
    QVar28.field_0.m_data = aVar2.m_data;
    __n = (size_t)local_48.d.ptr;
    QXmlStreamWriter::writeAttribute(QVar28,QVar12);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 1) != 0) {
    __n = (size_t)(this->m_author).d.ptr;
    QVar13.m_size = __n;
    QVar13.field_0.m_data = (void *)0x8000000000000006;
    QVar29.m_size = (size_t)L"author";
    QVar29.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeTextElement(QVar29,QVar13);
  }
  if ((this->m_children & 2) != 0) {
    __n = (size_t)(this->m_comment).d.ptr;
    QVar14.m_size = __n;
    QVar14.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
    QVar30.m_size = (size_t)L"comment";
    QVar30.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeTextElement(QVar30,QVar14);
  }
  if ((this->m_children & 4) != 0) {
    __n = (size_t)(this->m_exportMacro).d.ptr;
    QVar15.m_size = __n;
    QVar15.field_0.m_data = (void *)0x800000000000000b;
    QVar31.m_size = (size_t)L"exportmacro";
    QVar31.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeTextElement(QVar31,QVar15);
  }
  if ((this->m_children & 8) != 0) {
    __n = (size_t)(this->m_class).d.ptr;
    QVar16.m_size = __n;
    QVar16.field_0.m_data = (void *)0x8000000000000005;
    QVar32.m_size = (size_t)L"class";
    QVar32.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeTextElement(QVar32,QVar16);
  }
  if ((this->m_children & 0x10) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"widget";
    local_48.d.size = 6;
    DomWidget::write(this->m_widget,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x20) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"layoutdefault";
    local_48.d.size = 0xd;
    DomLayoutDefault::write(this->m_layoutDefault,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x40) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"layoutfunction";
    local_48.d.size = 0xe;
    DomLayoutFunction::write(this->m_layoutFunction,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x80) != 0) {
    __n = (size_t)(this->m_pixmapFunction).d.ptr;
    QVar17.m_size = __n;
    QVar17.field_0.m_data = (void *)0x800000000000000e;
    QVar33.m_size = (size_t)L"pixmapfunction";
    QVar33.field_0.m_data = aVar2.m_data;
    QXmlStreamWriter::writeTextElement(QVar33,QVar17);
  }
  if ((this->m_children & 0x100) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"customwidgets";
    local_48.d.size = 0xd;
    DomCustomWidgets::write(this->m_customWidgets,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x200) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"tabstops";
    local_48.d.size = 8;
    DomTabStops::write(this->m_tabStops,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x400) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"includes";
    local_48.d.size = 8;
    DomIncludes::write(this->m_includes,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x800) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"resources";
    local_48.d.size = 9;
    DomResources::write(this->m_resources,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x1000) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"connections";
    local_48.d.size = 0xb;
    DomConnections::write(this->m_connections,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x2000) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"designerdata";
    local_48.d.size = 0xc;
    DomDesignerData::write(this->m_designerdata,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x4000) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"slots";
    local_48.d.size = 5;
    DomSlots::write(this->m_slots,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((this->m_children & 0x8000) != 0) {
    local_48.d.d = (Data *)0x0;
    local_48.d.ptr = L"buttongroups";
    local_48.d.size = 0xc;
    DomButtonGroups::write(this->m_buttonGroups,__fd,&local_48,__n);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomUI::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("ui") : tagName.toLower());

    if (hasAttributeVersion())
        writer.writeAttribute(u"version"_s, attributeVersion());

    if (hasAttributeLanguage())
        writer.writeAttribute(u"language"_s, attributeLanguage());

    if (hasAttributeDisplayname())
        writer.writeAttribute(u"displayname"_s, attributeDisplayname());

    if (hasAttributeIdbasedtr())
        writer.writeAttribute(u"idbasedtr"_s, (attributeIdbasedtr() ? u"true"_s : u"false"_s));

    if (hasAttributeConnectslotsbyname())
        writer.writeAttribute(u"connectslotsbyname"_s, (attributeConnectslotsbyname() ? u"true"_s : u"false"_s));

    if (hasAttributeStdsetdef())
        writer.writeAttribute(u"stdsetdef"_s, QString::number(attributeStdsetdef()));

    if (hasAttributeStdSetDef())
        writer.writeAttribute(u"stdsetdef"_s, QString::number(attributeStdSetDef()));

    if (m_children & Author)
        writer.writeTextElement(u"author"_s, m_author);

    if (m_children & Comment)
        writer.writeTextElement(u"comment"_s, m_comment);

    if (m_children & ExportMacro)
        writer.writeTextElement(u"exportmacro"_s, m_exportMacro);

    if (m_children & Class)
        writer.writeTextElement(u"class"_s, m_class);

    if (m_children & Widget)
        m_widget->write(writer, u"widget"_s);

    if (m_children & LayoutDefault)
        m_layoutDefault->write(writer, u"layoutdefault"_s);

    if (m_children & LayoutFunction)
        m_layoutFunction->write(writer, u"layoutfunction"_s);

    if (m_children & PixmapFunction)
        writer.writeTextElement(u"pixmapfunction"_s, m_pixmapFunction);

    if (m_children & CustomWidgets)
        m_customWidgets->write(writer, u"customwidgets"_s);

    if (m_children & TabStops)
        m_tabStops->write(writer, u"tabstops"_s);

    if (m_children & Includes)
        m_includes->write(writer, u"includes"_s);

    if (m_children & Resources)
        m_resources->write(writer, u"resources"_s);

    if (m_children & Connections)
        m_connections->write(writer, u"connections"_s);

    if (m_children & Designerdata)
        m_designerdata->write(writer, u"designerdata"_s);

    if (m_children & Slots)
        m_slots->write(writer, u"slots"_s);

    if (m_children & ButtonGroups)
        m_buttonGroups->write(writer, u"buttongroups"_s);

    writer.writeEndElement();
}